

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

void immutable::rrb_details::promote_rightmost_leaf<int,false,6>
               (ref<immutable::rrb<int,_false,_6>_> *new_rrb)

{
  uint32_t uVar1;
  ref<immutable::rrb_details::internal_node<int,_false>_> *prVar2;
  uint32_t *puVar3;
  rrb<int,_false,_6> *prVar4;
  internal_node<int,_false> *piVar5;
  ulong uVar6;
  rrb_size_table<false> *prVar7;
  uint uVar8;
  ref<immutable::rrb_details::internal_node<int,_false>_> *local_120;
  ref<immutable::rrb_details::internal_node<int,_false>_> *local_98;
  ref<immutable::rrb_details::rrb_size_table<false>_> local_90;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_88;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_80;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_78;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_70;
  uint32_t local_64;
  uint local_60;
  uint32_t tail_len;
  uint32_t height;
  uint32_t shift;
  uint32_t i;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_48;
  ref<immutable::rrb_details::internal_node<int,_false>_> path [7];
  ref<immutable::rrb<int,_false,_6>_> *new_rrb_local;
  
  local_98 = &local_48;
  path[6].ptr = (internal_node<int,_false> *)new_rrb;
  do {
    ref<immutable::rrb_details::internal_node<int,_false>_>::ref(local_98);
    local_98 = local_98 + 1;
  } while (local_98 != path + 6);
  prVar4 = ref<immutable::rrb<int,_false,_6>_>::operator->
                     ((ref<immutable::rrb<int,_false,_6>_> *)path[6].ptr);
  ref<immutable::rrb_details::internal_node<int,false>>::operator=
            ((ref<immutable::rrb_details::internal_node<int,false>> *)&local_48,&prVar4->root);
  height = 0;
  for (tail_len = 0; uVar1 = tail_len,
      prVar4 = ref<immutable::rrb<int,_false,_6>_>::operator->
                         ((ref<immutable::rrb<int,_false,_6>_> *)path[6].ptr), uVar1 < prVar4->shift
      ; tail_len = tail_len + 6) {
    piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                       (path + ((ulong)height - 1));
    prVar2 = piVar5->child;
    piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                       (path + ((ulong)height - 1));
    ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
              (path + ((ulong)(height + 1) - 1),prVar2 + (piVar5->len - 1));
    height = height + 1;
  }
  local_60 = height;
  uVar6 = (ulong)height;
  prVar4 = ref<immutable::rrb<int,_false,_6>_>::operator->
                     ((ref<immutable::rrb<int,_false,_6>_> *)path[6].ptr);
  ref<immutable::rrb_details::leaf_node<int,false>>::operator=
            ((ref<immutable::rrb_details::leaf_node<int,false>> *)&prVar4->tail,path + (uVar6 - 1));
  piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                     (path + ((ulong)local_60 - 1));
  uVar1 = piVar5->len;
  prVar4 = ref<immutable::rrb<int,_false,_6>_>::operator->
                     ((ref<immutable::rrb<int,_false,_6>_> *)path[6].ptr);
  prVar4->tail_len = uVar1;
  prVar4 = ref<immutable::rrb<int,_false,_6>_>::operator->
                     ((ref<immutable::rrb<int,_false,_6>_> *)path[6].ptr);
  local_64 = prVar4->tail_len;
  ref<immutable::rrb_details::internal_node<int,_false>_>::ref
            (&local_70,(internal_node<int,_false> *)0x0);
  ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
            (path + ((ulong)local_60 - 1),&local_70);
  ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_70);
  while (uVar8 = height - 1, height != 0) {
    if (path[(ulong)height - 1].ptr == (internal_node<int,_false> *)0x0) {
      height = uVar8;
      piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                         (path + ((ulong)uVar8 - 1));
      if (piVar5->len == 1) {
        ref<immutable::rrb_details::internal_node<int,_false>_>::ref
                  (&local_78,(internal_node<int,_false> *)0x0);
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  (path + ((ulong)height - 1),&local_78);
        ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_78);
      }
      else if ((height == 0) &&
              (piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                                  (&local_48), piVar5->len == 2)) {
        piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                           (path + ((ulong)height - 1));
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  (path + ((ulong)height - 1),piVar5->child);
        prVar4 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)path[6].ptr);
        prVar4->shift = prVar4->shift - 6;
      }
      else {
        piVar5 = internal_node_dec<int,false>(path[(ulong)height - 1].ptr);
        ref<immutable::rrb_details::internal_node<int,_false>_>::ref(&local_80,piVar5);
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  (path + ((ulong)height - 1),&local_80);
        ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_80);
      }
    }
    else {
      height = uVar8;
      piVar5 = internal_node_clone<int,false>(path[(ulong)uVar8 - 1].ptr);
      ref<immutable::rrb_details::internal_node<int,_false>_>::ref(&local_88,piVar5);
      ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                (path + ((ulong)height - 1),&local_88);
      ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_88);
      uVar8 = height + 1;
      piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                         (path + ((ulong)height - 1));
      prVar2 = piVar5->child;
      piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                         (path + ((ulong)height - 1));
      ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                (prVar2 + (piVar5->len - 1),path + ((ulong)uVar8 - 1));
      piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                         (path + ((ulong)height - 1));
      if ((piVar5->size_table).ptr != (rrb_size_table<false> *)0x0) {
        piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                           (path + ((ulong)height - 1));
        prVar7 = (piVar5->size_table).ptr;
        piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                           (path + ((ulong)height - 1));
        prVar7 = size_table_clone<false>(prVar7,piVar5->len);
        ref<immutable::rrb_details::rrb_size_table<false>_>::ref(&local_90,prVar7);
        piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                           (path + ((ulong)height - 1));
        ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                  (&piVar5->size_table,&local_90);
        ref<immutable::rrb_details::rrb_size_table<false>_>::~ref(&local_90);
        uVar1 = local_64;
        piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                           (path + ((ulong)height - 1));
        prVar7 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                           (&piVar5->size_table);
        puVar3 = prVar7->size;
        piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                           (path + ((ulong)height - 1));
        uVar8 = piVar5->len - 1;
        puVar3[uVar8] = puVar3[uVar8] - uVar1;
      }
    }
  }
  height = uVar8;
  prVar4 = ref<immutable::rrb<int,_false,_6>_>::operator->
                     ((ref<immutable::rrb<int,_false,_6>_> *)path[6].ptr);
  ref<immutable::rrb_details::tree_node<int,false>>::operator=
            ((ref<immutable::rrb_details::tree_node<int,false>> *)&prVar4->root,&local_48);
  local_120 = path + 6;
  do {
    local_120 = local_120 + -1;
    ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(local_120);
  } while (local_120 != &local_48);
  return;
}

Assistant:

inline void promote_rightmost_leaf(ref<rrb<T, atomic_ref_counting, N>>& new_rrb)
      {
      ref<internal_node<T, atomic_ref_counting>> path[bits<N>::rrb_max_height + 1];
      path[0] = new_rrb->root;
      uint32_t i = 0, shift = 0;

      // populate path array
      for (i = 0, shift = 0; shift < new_rrb->shift; i++, shift += bits<N>::rrb_bits)
        {
        path[i + 1] = path[i]->child[path[i]->len - 1];
        }

      const uint32_t height = i;
      // Set the leaf node as tail.
      new_rrb->tail = path[height];
      new_rrb->tail_len = path[height]->len;
      const uint32_t tail_len = new_rrb->tail_len;

      // last element is now always null, in contrast to direct pop
      path[height] = ref<internal_node<T, atomic_ref_counting>>(nullptr);

      while (i-- > 0)
        {
        // TODO: First skip will always happen. Can we use that somehow?
        if (path[i + 1].ptr == nullptr)
          {
          if (path[i]->len == 1)
            {
            path[i] = ref<internal_node<T, atomic_ref_counting>>(nullptr);
            }
          else if (i == 0 && path[i]->len == 2)
            {
            path[i] = path[i]->child[0];
            new_rrb->shift -= bits<N>::rrb_bits;
            }
          else
            {
            path[i] = internal_node_dec(path[i].ptr);
            }
          }
        else
          {
          path[i] = internal_node_clone(path[i].ptr);
          path[i]->child[path[i]->len - 1] = path[i + 1];
          if (path[i]->size_table.ptr != nullptr)
            {
            path[i]->size_table = size_table_clone(path[i]->size_table.ptr, path[i]->len);
            // this line differs, as we remove `tail_len` elements from the trie,
            // instead of just 1 as in the direct pop algorithm.
            path[i]->size_table->size[path[i]->len - 1] -= tail_len;
            }
          }
        }

      new_rrb->root = path[0];
      }